

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter.cpp
# Opt level: O0

bool __thiscall
BamTools::BamAlignmentChecker::checkAlignmentTag
          (BamAlignmentChecker *this,PropertyFilterValue *valueFilter,BamAlignment *al)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  ulong uVar4;
  bool keepAlignment;
  ValueCompareType compareType;
  PropertyFilterValue tagFilter;
  string stringQueryValue;
  string stringFilterValue;
  float realQueryValue;
  float realFilterValue;
  uint32_t uintQueryValue;
  uint32_t uintFilterValue;
  int32_t intQueryValue;
  int32_t intFilterValue;
  int8_t asciiQueryValue;
  int8_t asciiFilterValue;
  string tagFilterString;
  char tagType;
  string *tagName;
  string *entireTagFilterString;
  Variant entireTagFilter;
  Variant *in_stack_fffffffffffffdf8;
  Variant *in_stack_fffffffffffffe00;
  Variant *in_stack_fffffffffffffe08;
  undefined5 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe15;
  undefined1 in_stack_fffffffffffffe16;
  undefined1 in_stack_fffffffffffffe17;
  string *in_stack_fffffffffffffe18;
  char v_02;
  int v;
  uint v_00;
  float v_01;
  string *in_stack_fffffffffffffe20;
  float *query;
  undefined5 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2d;
  undefined1 in_stack_fffffffffffffe2e;
  undefined1 in_stack_fffffffffffffe2f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  Variant *in_stack_fffffffffffffe50;
  string local_160 [8];
  char *in_stack_fffffffffffffea8;
  string *in_stack_fffffffffffffeb0;
  BamAlignment *in_stack_fffffffffffffeb8;
  Variant local_140 [5];
  byte local_111;
  undefined4 local_10c;
  Variant local_108;
  float local_100 [2];
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  string *in_stack_ffffffffffffff10;
  BamAlignment *in_stack_ffffffffffffff18;
  string local_d0 [64];
  string local_90 [39];
  undefined1 local_69;
  string local_68 [32];
  string *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  undefined4 local_38;
  byte local_1;
  
  Variant::Variant(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  bVar1 = Variant::is_type<std::__cxx11::string>(in_stack_fffffffffffffe00);
  if (bVar1) {
    local_40 = Variant::get<std::__cxx11::string>((Variant *)0x215cbd);
    uVar4 = std::__cxx11::string::length();
    if (uVar4 < 4) {
      local_1 = 0;
      local_38 = 1;
    }
    else {
      std::__cxx11::string::substr((ulong)local_68,(ulong)local_40);
      local_48 = local_68;
      local_69 = 0;
      bVar1 = BamAlignment::GetTagType
                        (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                         in_stack_fffffffffffffea8);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)local_90,(ulong)local_40);
        std::__cxx11::string::string(local_d0);
        std::__cxx11::string::string((string *)&stack0xffffffffffffff10);
        Variant::Variant(&local_108);
        local_10c = 2;
        PropertyFilterValue::PropertyFilterValue
                  ((PropertyFilterValue *)
                   CONCAT17(in_stack_fffffffffffffe17,
                            CONCAT16(in_stack_fffffffffffffe16,
                                     CONCAT15(in_stack_fffffffffffffe15,in_stack_fffffffffffffe10)))
                   ,in_stack_fffffffffffffe08,(ValueCompareType *)in_stack_fffffffffffffe00);
        Variant::~Variant(in_stack_fffffffffffffe00);
        local_111 = 0;
        switch(local_69) {
        case 0x41:
          bVar1 = BamAlignment::GetTag<signed_char>
                            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
          v_02 = (char)((ulong)in_stack_fffffffffffffe18 >> 0x38);
          if ((bVar1) &&
             (bVar1 = FilterEngine<BamTools::BamAlignmentChecker>::parseToken<signed_char>
                                ((string *)stringQueryValue.field_2._M_allocated_capacity,
                                 (char *)stringQueryValue._M_string_length,
                                 (ValueCompareType *)stringQueryValue._0_8_), bVar1)) {
            Variant::Variant<signed_char>((Variant *)in_stack_fffffffffffffe20,v_02);
            Variant::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
            Variant::~Variant(in_stack_fffffffffffffe00);
            local_111 = PropertyFilterValue::check<signed_char>
                                  ((PropertyFilterValue *)
                                   CONCAT17(in_stack_fffffffffffffe2f,
                                            CONCAT16(in_stack_fffffffffffffe2e,
                                                     CONCAT15(in_stack_fffffffffffffe2d,
                                                              in_stack_fffffffffffffe28))),
                                   (char *)in_stack_fffffffffffffe20);
          }
          break;
        default:
          local_111 = 0;
          break;
        case 0x43:
        case 0x49:
        case 0x53:
          bVar1 = BamAlignment::GetTag<unsigned_int>
                            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             (uint *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
          v_00 = (uint)((ulong)in_stack_fffffffffffffe18 >> 0x20);
          if ((bVar1) &&
             (bVar1 = FilterEngine<BamTools::BamAlignmentChecker>::parseToken<unsigned_int>
                                ((string *)stringQueryValue.field_2._M_allocated_capacity,
                                 (uint *)stringQueryValue._M_string_length,
                                 (ValueCompareType *)stringQueryValue._0_8_), bVar1)) {
            Variant::Variant<unsigned_int>((Variant *)in_stack_fffffffffffffe20,v_00);
            Variant::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
            Variant::~Variant(in_stack_fffffffffffffe00);
            local_111 = PropertyFilterValue::check<unsigned_int>
                                  ((PropertyFilterValue *)
                                   CONCAT17(in_stack_fffffffffffffe2f,
                                            CONCAT16(in_stack_fffffffffffffe2e,
                                                     CONCAT15(in_stack_fffffffffffffe2d,
                                                              in_stack_fffffffffffffe28))),
                                   (uint *)in_stack_fffffffffffffe20);
          }
          break;
        case 0x48:
        case 0x5a:
          bVar1 = BamAlignment::GetTag<std::__cxx11::string>
                            ((BamAlignment *)
                             CONCAT17(in_stack_fffffffffffffe2f,
                                      CONCAT16(in_stack_fffffffffffffe2e,
                                               CONCAT15(in_stack_fffffffffffffe2d,
                                                        in_stack_fffffffffffffe28))),
                             in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          if ((bVar1) &&
             (bVar1 = FilterEngine<BamTools::BamAlignmentChecker>::parseToken<std::__cxx11::string>
                                ((string *)stringFilterValue.field_2._M_allocated_capacity,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)stringFilterValue._M_string_length,
                                 (ValueCompareType *)stringFilterValue._0_8_), bVar1)) {
            std::__cxx11::string::string(local_160,local_d0);
            Variant::Variant<std::__cxx11::string>
                      (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
            in_stack_fffffffffffffe00 = local_140;
            Variant::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
            Variant::~Variant(in_stack_fffffffffffffe00);
            std::__cxx11::string::~string(local_160);
            local_111 = PropertyFilterValue::check
                                  ((PropertyFilterValue *)
                                   CONCAT17(in_stack_fffffffffffffe2f,
                                            CONCAT16(in_stack_fffffffffffffe2e,
                                                     CONCAT15(in_stack_fffffffffffffe2d,
                                                              in_stack_fffffffffffffe28))),
                                   in_stack_fffffffffffffe20);
          }
          break;
        case 99:
        case 0x69:
        case 0x73:
          bVar1 = BamAlignment::GetTag<int>
                            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
          v = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
          if ((bVar1) &&
             (bVar1 = FilterEngine<BamTools::BamAlignmentChecker>::parseToken<int>
                                ((string *)stringFilterValue._0_8_,
                                 (int *)stringQueryValue.field_2._8_8_,
                                 (ValueCompareType *)stringQueryValue.field_2._M_allocated_capacity)
             , bVar1)) {
            Variant::Variant<int>((Variant *)in_stack_fffffffffffffe20,v);
            Variant::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
            Variant::~Variant(in_stack_fffffffffffffe00);
            local_111 = PropertyFilterValue::check<int>
                                  ((PropertyFilterValue *)
                                   CONCAT17(in_stack_fffffffffffffe2f,
                                            CONCAT16(in_stack_fffffffffffffe2e,
                                                     CONCAT15(in_stack_fffffffffffffe2d,
                                                              in_stack_fffffffffffffe28))),
                                   (int *)in_stack_fffffffffffffe20);
          }
          break;
        case 0x66:
          uVar2 = BamAlignment::GetTag<float>
                            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             (float *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
          ;
          v_01 = (float)((ulong)in_stack_fffffffffffffe18 >> 0x20);
          if (((bool)uVar2) &&
             (uVar3 = FilterEngine<BamTools::BamAlignmentChecker>::parseToken<float>
                                ((string *)stringQueryValue.field_2._M_allocated_capacity,
                                 (float *)stringQueryValue._M_string_length,
                                 (ValueCompareType *)stringQueryValue._0_8_), (bool)uVar3)) {
            Variant::Variant<float>((Variant *)in_stack_fffffffffffffe20,v_01);
            query = local_100;
            Variant::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
            Variant::~Variant(in_stack_fffffffffffffe00);
            local_111 = PropertyFilterValue::check<float>
                                  ((PropertyFilterValue *)
                                   CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(in_stack_fffffffffffffe2d,
                                                                          in_stack_fffffffffffffe28)
                                                          )),query);
          }
        }
        local_1 = local_111 & 1;
        local_38 = 1;
        PropertyFilterValue::~PropertyFilterValue((PropertyFilterValue *)0x216367);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
        std::__cxx11::string::~string(local_d0);
        std::__cxx11::string::~string(local_90);
      }
      else {
        local_1 = 0;
        local_38 = 1;
      }
      std::__cxx11::string::~string(local_68);
    }
  }
  else {
    local_1 = 0;
    local_38 = 1;
  }
  Variant::~Variant(in_stack_fffffffffffffe00);
  return (bool)(local_1 & 1);
}

Assistant:

bool checkAlignmentTag(const PropertyFilterValue& valueFilter, const BamAlignment& al)
    {

        // ensure filter contains string data
        Variant entireTagFilter = valueFilter.Value;
        if (!entireTagFilter.is_type<std::string>()) return false;

        // localize string from variant
        const std::string& entireTagFilterString = entireTagFilter.get<std::string>();

        // ensure we have at least "XX:x"
        if (entireTagFilterString.length() < 4) return false;

        // get tagName & lookup in alignment
        // if found, set tagType to tag type character
        // if not found, return false
        const std::string& tagName = entireTagFilterString.substr(0, 2);
        char tagType = '\0';
        if (!al.GetTagType(tagName, tagType)) return false;

        // remove tagName & ':' from beginning tagFilter
        std::string tagFilterString = entireTagFilterString.substr(3);

        // switch on tag type to set tag query value & parse filter token
        int8_t asciiFilterValue, asciiQueryValue;
        int32_t intFilterValue, intQueryValue;
        uint32_t uintFilterValue, uintQueryValue;
        float realFilterValue, realQueryValue;
        std::string stringFilterValue, stringQueryValue;

        PropertyFilterValue tagFilter;
        PropertyFilterValue::ValueCompareType compareType;
        bool keepAlignment = false;
        switch (tagType) {

            // ASCII tag type
            case 'A':
                if (al.GetTag(tagName, asciiQueryValue)) {
                    if (FilterEngine<BamAlignmentChecker>::parseToken(
                            tagFilterString, asciiFilterValue, compareType)) {
                        tagFilter.Value = asciiFilterValue;
                        tagFilter.Type = compareType;
                        keepAlignment = tagFilter.check(asciiQueryValue);
                    }
                }
                break;

            // signed int tag type
            case 'c':
            case 's':
            case 'i':
                if (al.GetTag(tagName, intQueryValue)) {
                    if (FilterEngine<BamAlignmentChecker>::parseToken(
                            tagFilterString, intFilterValue, compareType)) {
                        tagFilter.Value = intFilterValue;
                        tagFilter.Type = compareType;
                        keepAlignment = tagFilter.check(intQueryValue);
                    }
                }
                break;

            // unsigned int tag type
            case 'C':
            case 'S':
            case 'I':
                if (al.GetTag(tagName, uintQueryValue)) {
                    if (FilterEngine<BamAlignmentChecker>::parseToken(
                            tagFilterString, uintFilterValue, compareType)) {
                        tagFilter.Value = uintFilterValue;
                        tagFilter.Type = compareType;
                        keepAlignment = tagFilter.check(uintQueryValue);
                    }
                }
                break;

            // 'real' tag type
            case 'f':
                if (al.GetTag(tagName, realQueryValue)) {
                    if (FilterEngine<BamAlignmentChecker>::parseToken(
                            tagFilterString, realFilterValue, compareType)) {
                        tagFilter.Value = realFilterValue;
                        tagFilter.Type = compareType;
                        keepAlignment = tagFilter.check(realQueryValue);
                    }
                }
                break;

                // string tag type

            case 'Z':
            case 'H':
                if (al.GetTag(tagName, stringQueryValue)) {
                    if (FilterEngine<BamAlignmentChecker>::parseToken(
                            tagFilterString, stringFilterValue, compareType)) {
                        tagFilter.Value = stringFilterValue;
                        tagFilter.Type = compareType;
                        keepAlignment = tagFilter.check(stringQueryValue);
                    }
                }
                break;

            // unknown tag type
            default:
                keepAlignment = false;
        }

        return keepAlignment;
    }